

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall mjs::function_base::base_print(function_base *this,wostream *os)

{
  element_type *peVar1;
  wostream *pwVar2;
  pointer pbVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  std::operator<<(os,"{");
  if ((this->id_)._M_string_length != 0) {
    pwVar2 = std::operator<<(os,(wstring *)&this->id_);
    std::operator<<(pwVar2,", ");
  }
  std::operator<<(os,"[");
  lVar4 = 0;
  for (uVar5 = 0;
      pbVar3 = (this->params_).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->params_).
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
      uVar5 = uVar5 + 1) {
    if (uVar5 != 0) {
      std::operator<<(os,", ");
      pbVar3 = (this->params_).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::operator<<(os,(wstring *)((long)&(pbVar3->_M_dataplus)._M_p + lVar4));
    lVar4 = lVar4 + 0x20;
  }
  pwVar2 = std::operator<<(os,"], ");
  peVar1 = (this->block_).super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_statement).super_syntax_node._vptr_syntax_node[2])(peVar1,pwVar2);
  std::operator<<(pwVar2,"}");
  return;
}

Assistant:

void function_base::base_print(std::wostream& os) const {
    os << "{";
    if (!id_.empty()) os << id_ << ", ";
    os << "[";
    for (size_t i = 0; i < params_.size(); ++i) {
        if (i) os << ", ";
        os << params_[i];
    }
    os << "], " << *block_ << "}";
}